

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

TracingService * __thiscall
perfetto::internal::InProcessTracingBackend::GetOrCreateService
          (InProcessTracingBackend *this,TaskRunner *task_runner)

{
  TracingService *pTVar1;
  _Head_base<0UL,_perfetto::TracingService_*,_false> _Var2;
  _Head_base<0UL,_perfetto::SharedMemory::Factory_*,_false> local_20;
  _Head_base<0UL,_perfetto::TracingService_*,_false> local_18;
  
  if ((this->service_)._M_t.
      super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>
      ._M_t.
      super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
      .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl ==
      (TracingService *)0x0) {
    local_20._M_head_impl = (Factory *)operator_new(8);
    (local_20._M_head_impl)->_vptr_Factory = (_func_int **)&PTR__Factory_003cc688;
    TracingService::CreateInstance
              ((TracingService *)&local_18,
               (unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
                *)&local_20,task_runner);
    _Var2._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (TracingService *)0x0;
    pTVar1 = (this->service_)._M_t.
             super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
             .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl;
    (this->service_)._M_t.
    super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>.
    _M_t.
    super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
    .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pTVar1 != (TracingService *)0x0) {
      (*pTVar1->_vptr_TracingService[1])();
    }
    local_18._M_head_impl = (TracingService *)0x0;
    if (local_20._M_head_impl != (Factory *)0x0) {
      (*(local_20._M_head_impl)->_vptr_Factory[1])();
    }
    local_20._M_head_impl = (Factory *)0x0;
    pTVar1 = (this->service_)._M_t.
             super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
             .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl;
    (*pTVar1->_vptr_TracingService[4])(pTVar1,1);
  }
  return (this->service_)._M_t.
         super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
         .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl;
}

Assistant:

TracingService* InProcessTracingBackend::GetOrCreateService(
    base::TaskRunner* task_runner) {
  if (!service_) {
    std::unique_ptr<InProcessShmFactory> shm(new InProcessShmFactory());
    service_ = TracingService::CreateInstance(std::move(shm), task_runner);
    service_->SetSMBScrapingEnabled(true);
  }
  return service_.get();
}